

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void proto2_unittest::NonPackedFixed32::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  Nullable<const_char_*> failure_msg;
  NonPackedFixed32 *_this;
  NonPackedFixed32 *local_20;
  LogMessageFatal local_18;
  
  local_20 = (NonPackedFixed32 *)to_msg;
  local_18.super_LogMessage._0_8_ = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::NonPackedFixed32_const*,proto2_unittest::NonPackedFixed32*>
                          ((NonPackedFixed32 **)&local_18,&local_20,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    google::protobuf::RepeatedField<unsigned_int>::MergeFrom
              (&(local_20->field_0)._impl_.repeated_fixed32_,
               (RepeatedField<unsigned_int> *)(from_msg + 1));
    google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
              (&(local_20->super_MessageLite)._internal_metadata_,&from_msg->_internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_lite.pb.cc"
             ,0x3231,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_18);
}

Assistant:

void NonPackedFixed32::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<NonPackedFixed32*>(&to_msg);
  auto& from = static_cast<const NonPackedFixed32&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.NonPackedFixed32)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_fixed32()->MergeFrom(from._internal_repeated_fixed32());
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}